

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void al_unref_user_event(ALLEGRO_USER_EVENT *event)

{
  int *piVar1;
  int iVar2;
  ALLEGRO_USER_EVENT_DESCRIPTOR *ptr;
  
  ptr = event->__internal__descr;
  if (ptr != (ALLEGRO_USER_EVENT_DESCRIPTOR *)0x0) {
    _al_mutex_lock(&user_event_refcount_mutex);
    piVar1 = &ptr->refcount;
    *piVar1 = *piVar1 + -1;
    iVar2 = *piVar1;
    _al_mutex_unlock(&user_event_refcount_mutex);
    if (iVar2 == 0) {
      (*ptr->dtor)(event);
      al_free_with_context
                (ptr,0x2cf,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/events.c"
                 ,"al_unref_user_event");
      return;
    }
  }
  return;
}

Assistant:

void al_unref_user_event(ALLEGRO_USER_EVENT *event)
{
   ALLEGRO_USER_EVENT_DESCRIPTOR *descr;
   int refcount;

   ASSERT(event);

   descr = event->__internal__descr;
   if (descr) {
      _al_mutex_lock(&user_event_refcount_mutex);
      ASSERT(descr->refcount > 0);
      refcount = --descr->refcount;
      _al_mutex_unlock(&user_event_refcount_mutex);

      if (refcount == 0) {
         (descr->dtor)(event);
         al_free(descr);
      }
   }
}